

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int indexMightHelpWithOrderBy(WhereLoopBuilder *pBuilder,Index *pIndex,int iCursor)

{
  ExprList *pEVar1;
  ExprList *pEVar2;
  int iVar3;
  Expr *pA;
  Expr *pExpr;
  int jj;
  int ii;
  ExprList *aColExpr;
  ExprList *pOB;
  int iCursor_local;
  Index *pIndex_local;
  WhereLoopBuilder *pBuilder_local;
  
  if (((*(ushort *)&pIndex->field_0x63 >> 2 & 1) == 0) &&
     (pEVar1 = pBuilder->pWInfo->pOrderBy, pEVar1 != (ExprList *)0x0)) {
    for (pExpr._4_4_ = 0; pExpr._4_4_ < pEVar1->nExpr; pExpr._4_4_ = pExpr._4_4_ + 1) {
      pA = sqlite3ExprSkipCollate(pEVar1->a[pExpr._4_4_].pExpr);
      if ((pA->op == 0xa2) && (pA->iTable == iCursor)) {
        if (pA->iColumn < 0) {
          return 1;
        }
        for (pExpr._0_4_ = 0; (int)pExpr < (int)(uint)pIndex->nKeyCol; pExpr._0_4_ = (int)pExpr + 1)
        {
          if (pA->iColumn == pIndex->aiColumn[(int)pExpr]) {
            return 1;
          }
        }
      }
      else {
        pEVar2 = pIndex->aColExpr;
        if (pEVar2 != (ExprList *)0x0) {
          for (pExpr._0_4_ = 0; (int)pExpr < (int)(uint)pIndex->nKeyCol;
              pExpr._0_4_ = (int)pExpr + 1) {
            if ((pIndex->aiColumn[(int)pExpr] == -2) &&
               (iVar3 = sqlite3ExprCompareSkip(pA,pEVar2->a[(int)pExpr].pExpr,iCursor), iVar3 == 0))
            {
              return 1;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int indexMightHelpWithOrderBy(
  WhereLoopBuilder *pBuilder,
  Index *pIndex,
  int iCursor
){
  ExprList *pOB;
  ExprList *aColExpr;
  int ii, jj;

  if( pIndex->bUnordered ) return 0;
  if( (pOB = pBuilder->pWInfo->pOrderBy)==0 ) return 0;
  for(ii=0; ii<pOB->nExpr; ii++){
    Expr *pExpr = sqlite3ExprSkipCollate(pOB->a[ii].pExpr);
    if( pExpr->op==TK_COLUMN && pExpr->iTable==iCursor ){
      if( pExpr->iColumn<0 ) return 1;
      for(jj=0; jj<pIndex->nKeyCol; jj++){
        if( pExpr->iColumn==pIndex->aiColumn[jj] ) return 1;
      }
    }else if( (aColExpr = pIndex->aColExpr)!=0 ){
      for(jj=0; jj<pIndex->nKeyCol; jj++){
        if( pIndex->aiColumn[jj]!=XN_EXPR ) continue;
        if( sqlite3ExprCompareSkip(pExpr,aColExpr->a[jj].pExpr,iCursor)==0 ){
          return 1;
        }
      }
    }
  }
  return 0;
}